

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  uint *pk_parity;
  undefined4 *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  secp256k1_callback *error_callback;
  byte bVar6;
  int i;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint32_t uVar10;
  uint uVar11;
  ulong uVar12;
  FILE *__stream;
  size_t sVar13;
  secp256k1_ge *psVar14;
  secp256k1_gej *psVar15;
  secp256k1_context *ctx;
  secp256k1_scratch *scratch;
  void *pvVar16;
  ulong extraout_RAX;
  byte bVar17;
  int j;
  undefined4 uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  secp256k1_fe *psVar22;
  void *pvVar23;
  secp256k1_scratch *psVar24;
  int *piVar25;
  secp256k1_gej *gen;
  secp256k1_gej *gen_00;
  ulong uVar26;
  int pos;
  long lVar27;
  secp256k1_context *psVar28;
  char **ppcVar29;
  uint64_t *puVar30;
  secp256k1_keypair *keypair;
  secp256k1_scalar sVar31;
  int iVar32;
  secp256k1_ge *psVar33;
  char **ppcVar34;
  undefined1 *puVar35;
  undefined4 uVar36;
  secp256k1_gej *psVar37;
  uint64_t *puVar38;
  secp256k1_pubkey *pubkey;
  secp256k1_context *a;
  uint64_t uVar39;
  _func_void_char_ptr_void_ptr *na_00;
  uint64_t uVar40;
  ulong uVar41;
  ulong uVar42;
  int iVar43;
  long lVar44;
  size_t sVar45;
  secp256k1_gej *psVar46;
  secp256k1_scalar *output32;
  uchar *p1;
  char *pcVar47;
  secp256k1_ge *psVar48;
  secp256k1_context *a_00;
  ulong uVar49;
  char **num;
  int iVar50;
  secp256k1_ge_storage (*pasVar51) [16];
  secp256k1_scalar *psVar52;
  secp256k1_xonly_pubkey *pubkey_00;
  bool bVar53;
  byte bVar54;
  undefined1 auVar55 [16];
  ulong local_1af8;
  secp256k1_scalar *local_1af0;
  ulong local_1ae8;
  ulong local_1ad8;
  int local_1ac4;
  secp256k1_gej *local_1ac0;
  char **local_1ab8;
  long local_1ab0;
  long local_1aa8;
  secp256k1_callback *local_1aa0;
  secp256k1_scalar ng_1;
  undefined1 auStack_1a94 [12];
  secp256k1_fe *psStack_1a90;
  undefined1 local_1a88 [16];
  undefined1 local_1a78 [16];
  int local_1a68;
  ulong local_1a58;
  secp256k1_scalar e;
  secp256k1_scalar ng;
  undefined1 auStack_1a44 [12];
  undefined8 uStack_1a40;
  undefined1 local_1a38 [16];
  int iStack_1a1c;
  secp256k1_scalar na;
  secp256k1_scalar sStack_1a14;
  uint64_t uStack_1a10;
  uint64_t local_1a08;
  uint64_t uStack_1a00;
  undefined4 local_19f8;
  undefined4 uStack_19f4;
  undefined8 uStack_19f0;
  void *local_19e0;
  secp256k1_scratch *local_19d8;
  size_t local_19d0;
  undefined1 local_19c8 [16];
  undefined1 local_19b8 [16];
  uint64_t local_19a8;
  uint64_t local_19a0;
  uint64_t local_1998;
  secp256k1_fe *local_1990;
  long local_1988;
  void *local_1980;
  _func_void_char_ptr_void_ptr *local_1978;
  secp256k1_scalar e_1;
  secp256k1_nonce_function_hardened local_1968;
  int *local_1960;
  secp256k1_gej tmp_3;
  undefined1 local_17f8 [32];
  uchar rand32 [32];
  secp256k1_scalar scalar_i;
  secp256k1_scalar sStack_17b4;
  undefined8 uStack_17b0;
  undefined1 local_17a8 [15];
  uchar uStack_1799;
  uchar local_1798 [8];
  int iStack_1790;
  int iStack_178c;
  undefined1 auStack_1788 [15];
  uchar local_1779;
  secp256k1_fe nums_x;
  undefined1 local_1488 [32];
  undefined4 local_1468;
  undefined4 uStack_1464;
  int iStack_1460;
  int iStack_145c;
  int local_1458;
  uchar seed16 [16];
  byte abStack_1198 [80];
  uint64_t local_1148 [130];
  secp256k1_ge group [13];
  undefined1 auStack_7f0 [8];
  secp256k1_gej groupj [13];
  
  bVar54 = 0;
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  printf("Exhaustive tests for order %lu\n");
  local_1af8 = (ulong)(uint)argc;
  local_1ab8 = argv;
  if (argc < 2) {
    printf("test count = %i\n",(ulong)(uint)count);
  }
  else {
    uVar12 = strtol(argv[1],(char **)0x0,0);
    count = (int)uVar12;
    printf("test count = %i\n",uVar12 & 0xffffffff);
    if (argc != 2) {
      pcVar47 = argv[2];
      seed16[0] = '\0';
      seed16[1] = '\0';
      seed16[2] = '\0';
      seed16[3] = '\0';
      seed16[4] = '\0';
      seed16[5] = '\0';
      seed16[6] = '\0';
      seed16[7] = '\0';
      seed16[8] = '\0';
      seed16[9] = '\0';
      seed16[10] = '\0';
      seed16[0xb] = '\0';
      seed16[0xc] = '\0';
      seed16[0xd] = '\0';
      seed16[0xe] = '\0';
      seed16[0xf] = '\0';
      if ((pcVar47 != (char *)0x0) && (*pcVar47 != '\0')) {
        lVar27 = 0;
        do {
          local_1af8._0_4_ = argc;
          if (pcVar47[1] == '\0') goto LAB_00115666;
          iVar7 = __isoc99_sscanf(pcVar47,"%2hx",groupj);
          if (iVar7 != 1) goto LAB_00115666;
          seed16[lVar27] = (uchar)groupj[0].x.n[0];
          if (lVar27 == 0xf) goto LAB_00115666;
          lVar27 = lVar27 + 1;
          pcVar1 = pcVar47 + 2;
          pcVar47 = pcVar47 + 2;
          if (*pcVar1 == '\0') goto LAB_00115666;
        } while( true );
      }
    }
  }
  seed16[8] = '\0';
  seed16[9] = '\0';
  seed16[10] = '\0';
  seed16[0xb] = '\0';
  seed16[0xc] = '\0';
  seed16[0xd] = '\0';
  seed16[0xe] = '\0';
  seed16[0xf] = '\0';
  seed16[0] = '\0';
  seed16[1] = '\0';
  seed16[2] = '\0';
  seed16[3] = '\0';
  seed16[4] = '\0';
  seed16[5] = '\0';
  seed16[6] = '\0';
  seed16[7] = '\0';
  __stream = fopen("/dev/urandom","rb");
  if ((__stream != (FILE *)0x0) &&
     (sVar13 = fread(seed16,1,0x10,__stream), iVar7 = argc, sVar13 == 0x10)) goto LAB_0011565e;
LAB_001179fe:
  main_cold_1();
  iVar7 = (int)local_1af8;
  if ((extraout_RAX & 1) == 0) {
LAB_0011565e:
    local_1af8._0_4_ = iVar7;
    fclose(__stream);
  }
LAB_00115666:
  local_1ac0 = (secp256k1_gej *)((ulong)seed16._8_8_ >> 8 & 0xff);
  lVar27 = 0;
  printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
         seed16._0_8_ & 0xff,(ulong)seed16._0_8_ >> 8 & 0xff);
  groupj[0].x.n[0] = 0xbb67ae856a09e667;
  groupj[0].x.n[1] = 0xa54ff53a3c6ef372;
  groupj[0].x.n[2] = 0x9b05688c510e527f;
  groupj[0].x.n[3] = 0x5be0cd191f83d9ab;
  groupj[0].z.n[0] = 0;
  secp256k1_sha256_write((secp256k1_sha256 *)groupj,(uchar *)"secp256k1 test init",0x13);
  secp256k1_sha256_write((secp256k1_sha256 *)groupj,seed16,0x10);
  psVar14 = group;
  secp256k1_sha256_finalize((secp256k1_sha256 *)groupj,(uchar *)psVar14);
  ppcVar29 = local_1ab8;
  do {
    lVar21 = 0;
    uVar12 = 0;
    do {
      uVar12 = (ulong)*(byte *)((long)(psVar14->x).n + lVar21) | uVar12 << 8;
      lVar21 = lVar21 + 1;
    } while (lVar21 != 8);
    secp256k1_test_state[lVar27] = uVar12;
    lVar27 = lVar27 + 1;
    psVar14 = (secp256k1_ge *)((psVar14->x).n + 1);
  } while (lVar27 != 4);
  if (4 < (int)local_1af8) {
    lVar27 = strtol(local_1ab8[3],(char **)0x0,0);
    num_cores = (uint32_t)lVar27;
    uVar12 = strtol(ppcVar29[4],(char **)0x0,0);
    this_core = (uint32_t)uVar12;
    if (((ulong)num_cores == 0) || (num_cores <= this_core)) {
      main_cold_2();
      return 1;
    }
    printf("running tests for core %lu (out of [0..%lu])\n",uVar12 & 0xffffffff,(ulong)num_cores - 1
          );
  }
  a = (secp256k1_context *)0x1a000;
  psVar14 = (secp256k1_ge *)malloc(0x1a000);
  if (psVar14 != (secp256k1_ge *)0x0) {
    secp256k1_gej_set_ge(groupj,&secp256k1_ge_const_g);
    a = (secp256k1_context *)&nums_x;
    secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)a,(uchar *)"The scalar for this x is unknown");
    if ((0xffffefffffc2e < nums_x.n[0]) && (nums_x.n[4] == 0xffffffffffff)) {
      if ((nums_x.n[2] & nums_x.n[3] & nums_x.n[1]) == 0xfffffffffffff) goto LAB_00117aa6;
    }
    nums_x.magnitude = 1;
    nums_x.normalized = 1;
    secp256k1_fe_verify(&nums_x);
    a = (secp256k1_context *)seed16;
    iVar7 = secp256k1_ge_set_xo_var((secp256k1_ge *)a,&nums_x,0);
    if (iVar7 != 0) {
      secp256k1_gej_set_ge((secp256k1_gej *)group,(secp256k1_ge *)seed16);
      psVar22 = (secp256k1_fe *)0x0;
      secp256k1_gej_add_ge_var
                ((secp256k1_gej *)group,(secp256k1_gej *)group,&secp256k1_ge_const_g,
                 (secp256k1_fe *)0x0);
      a = (secp256k1_context *)0x26000;
      psVar15 = (secp256k1_gej *)malloc(0x26000);
      if (psVar15 != (secp256k1_gej *)0x0) {
        memcpy(seed16,groupj,0x98);
        memcpy(&nums_x,group,0x98);
        lVar27 = 0;
        psVar46 = psVar15;
        do {
          memcpy(psVar15 + lVar27 * 0x10,&nums_x,0x98);
          lVar21 = 0xf;
          psVar37 = psVar46;
          do {
            secp256k1_gej_add_var(psVar37 + 1,psVar37,(secp256k1_gej *)seed16,psVar22);
            lVar21 = lVar21 + -1;
            psVar37 = psVar37 + 1;
          } while (lVar21 != 0);
          iVar7 = 4;
          do {
            secp256k1_gej_double_var
                      ((secp256k1_gej *)seed16,(secp256k1_gej *)seed16,(secp256k1_fe *)0x0);
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
          secp256k1_gej_double_var
                    ((secp256k1_gej *)&nums_x,(secp256k1_gej *)&nums_x,(secp256k1_fe *)0x0);
          if (lVar27 == 0x3e) {
            secp256k1_gej_neg((secp256k1_gej *)&nums_x,(secp256k1_gej *)&nums_x);
            secp256k1_gej_add_var
                      ((secp256k1_gej *)&nums_x,(secp256k1_gej *)&nums_x,(secp256k1_gej *)group,
                       psVar22);
          }
          lVar27 = lVar27 + 1;
          psVar46 = psVar46 + 0x10;
        } while (lVar27 != 0x40);
        lVar27 = -1;
        lVar44 = 0;
        lVar21 = 0;
        psVar33 = psVar14;
        do {
          secp256k1_gej_verify((secp256k1_gej *)((long)(psVar15->x).n + lVar44));
          if (*(int *)((long)(&psVar15->z + 1) + lVar44) == 0) {
            if (lVar27 == -1) {
              puVar30 = (uint64_t *)((long)(psVar15->z).n + lVar44);
              uVar40 = *puVar30;
              uVar39 = puVar30[1];
              auVar3 = *(undefined1 (*) [16])((long)(psVar15->z).n + lVar44 + 0x10);
              puVar2 = (undefined4 *)((long)(psVar15->z).n + lVar44 + 0x20);
              uVar18 = puVar2[1];
              iVar7 = puVar2[2];
              iVar32 = puVar2[3];
              *(undefined4 *)((psVar33->x).n + 4) = *puVar2;
              *(undefined4 *)((long)(psVar33->x).n + 0x24) = uVar18;
              (psVar33->x).magnitude = iVar7;
              (psVar33->x).normalized = iVar32;
              *(undefined1 (*) [16])((psVar33->x).n + 2) = auVar3;
              (psVar33->x).n[0] = uVar40;
              (psVar33->x).n[1] = uVar39;
              lVar27 = lVar21;
            }
            else {
              secp256k1_fe_mul(&psVar33->x,&psVar14[lVar27].x,
                               (secp256k1_fe *)((long)(psVar15->z).n + lVar44));
              lVar27 = lVar21;
            }
          }
          else {
            secp256k1_ge_set_infinity(psVar33);
          }
          lVar21 = lVar21 + 1;
          psVar33 = psVar33 + 1;
          lVar44 = lVar44 + 0x98;
        } while (lVar21 != 0x400);
        if (lVar27 != -1) {
          a = (secp256k1_context *)&scalar_i;
          secp256k1_fe_inv_var((secp256k1_fe *)a,&psVar14[lVar27].x);
          if (lVar27 == 0) {
            lVar27 = 0;
          }
          else {
            psVar33 = psVar14 + lVar27;
            piVar25 = &psVar15[lVar27 + -1].infinity;
            lVar21 = lVar27;
            do {
              lVar21 = lVar21 + -1;
              psVar33 = psVar33 + -1;
              if (*piVar25 == 0) {
                a = (secp256k1_context *)&scalar_i;
                secp256k1_fe_mul(&psVar14[lVar27].x,&psVar33->x,(secp256k1_fe *)a);
                secp256k1_fe_mul((secp256k1_fe *)a,(secp256k1_fe *)a,&psVar15[lVar27].z);
                lVar27 = lVar21;
              }
              piVar25 = piVar25 + -0x26;
            } while (lVar21 != 0);
          }
          if (psVar15[lVar27].infinity != 0) goto LAB_00117a83;
          auVar3[0xf] = uStack_1799;
          auVar3._0_15_ = local_17a8;
          puVar30 = psVar14[lVar27].x.n + 4;
          *(undefined4 *)puVar30 = local_1798._0_4_;
          *(undefined4 *)((long)puVar30 + 4) = local_1798._4_4_;
          *(int *)(puVar30 + 1) = iStack_1790;
          *(int *)((long)puVar30 + 0xc) = iStack_178c;
          *(undefined1 (*) [16])(psVar14[lVar27].x.n + 2) = auVar3;
          psVar14[lVar27].x.n[0] = CONCAT44(sStack_17b4,scalar_i);
          psVar14[lVar27].x.n[1] = CONCAT17(uStack_17b0._7_1_,(undefined7)uStack_17b0);
          lVar27 = 0;
          psVar46 = psVar15;
          do {
            if (psVar46->infinity == 0) {
              psVar33 = (secp256k1_ge *)((long)(psVar14->x).n + lVar27);
              secp256k1_ge_set_gej_zinv(psVar33,psVar46,(secp256k1_fe *)psVar33);
            }
            secp256k1_ge_verify((secp256k1_ge *)((long)(psVar14->x).n + lVar27));
            lVar27 = lVar27 + 0x68;
            psVar46 = psVar46 + 1;
          } while (lVar27 != 0x1a000);
        }
        free(psVar15);
        pasVar51 = secp256k1_ecmult_gen_prec_table;
        lVar27 = 0;
        psVar33 = psVar14;
        do {
          lVar21 = 0;
          psVar48 = psVar33;
          do {
            secp256k1_ge_to_storage
                      ((secp256k1_ge_storage *)((long)(*pasVar51)[0].x.n + lVar21),psVar48);
            lVar21 = lVar21 + 0x40;
            psVar48 = psVar48 + 1;
          } while (lVar21 != 0x400);
          lVar27 = lVar27 + 1;
          psVar33 = psVar33 + 0x10;
          pasVar51 = pasVar51 + 1;
        } while (lVar27 != 0x40);
        free(psVar14);
        secp256k1_gej_set_ge(groupj,&secp256k1_ge_const_g);
        secp256k1_ecmult_compute_table(secp256k1_pre_g,(int)groupj,gen);
        iVar7 = 0x80;
        do {
          secp256k1_gej_double_var(groupj,groupj,(secp256k1_fe *)0x0);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        secp256k1_ecmult_compute_table(secp256k1_pre_g_128,(int)groupj,gen_00);
        iVar7 = count;
        while( true ) {
          count = iVar7 + -1;
          if (iVar7 == 0) {
            secp256k1_testrand256(seed16);
            printf("random run = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n"
                   ,seed16._0_8_ & 0xff,(ulong)seed16._0_8_ >> 8 & 0xff,
                   (ulong)seed16._0_8_ >> 0x10 & 0xff,(ulong)seed16._0_8_ >> 0x18 & 0xff,
                   (ulong)seed16._0_8_ >> 0x20 & 0xff,(ulong)seed16._0_8_ >> 0x28 & 0xff,
                   (ulong)seed16._0_8_ >> 0x30 & 0xff,(ulong)seed16._0_8_ >> 0x38,
                   seed16._8_8_ & 0xff,(ulong)seed16._8_8_ >> 8 & 0xff,
                   (ulong)seed16._8_8_ >> 0x10 & 0xff,(ulong)seed16._8_8_ >> 0x18 & 0xff,
                   (ulong)seed16._8_8_ >> 0x20 & 0xff,(ulong)seed16._8_8_ >> 0x28 & 0xff,
                   (ulong)seed16._8_8_ >> 0x30 & 0xff,(ulong)seed16._8_8_ >> 0x38);
            puts("no problems found");
            return 0;
          }
          ctx = secp256k1_context_create(1);
          secp256k1_testrand256(rand32);
          a = ctx;
          iVar7 = secp256k1_context_randomize(ctx,rand32);
          if (iVar7 == 0) break;
          secp256k1_gej_set_infinity(groupj);
          secp256k1_ge_set_gej(group,groupj);
          lVar27 = -0x4e0;
          sVar31 = 1;
          psVar15 = groupj;
          do {
            psVar46 = psVar15 + 1;
            secp256k1_gej_add_ge(psVar46,psVar15,&secp256k1_ge_const_g);
            secp256k1_ge_set_gej((secp256k1_ge *)(auStack_7f0 + lVar27),psVar46);
            if (count != 0) {
              random_fe((secp256k1_fe *)seed16);
              secp256k1_gej_rescale(psVar46,(secp256k1_fe *)seed16);
            }
            scalar_i = sVar31;
            secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,(secp256k1_gej *)seed16,&scalar_i);
            psVar28 = (secp256k1_context *)&nums_x;
            secp256k1_ge_set_gej((secp256k1_ge *)psVar28,(secp256k1_gej *)seed16);
            if (*(int *)((long)groupj[0].y.n + lVar27 + 0x28) != 0) goto LAB_00117a56;
            a = psVar28;
            if (local_1458 != 0) goto LAB_00117a5b;
            a = (secp256k1_context *)&nums_x;
            iVar7 = secp256k1_fe_equal_var((secp256k1_fe *)a,(secp256k1_fe *)(auStack_7f0 + lVar27))
            ;
            if (iVar7 == 0) goto LAB_00117a60;
            a = (secp256k1_context *)local_1488;
            iVar7 = secp256k1_fe_equal_var
                              ((secp256k1_fe *)a,
                               (secp256k1_fe *)((long)groupj[0].x.n + lVar27 + 0x28));
            if (iVar7 == 0) goto LAB_00117a65;
            sVar31 = sVar31 + 1;
            lVar27 = lVar27 + 0x68;
            psVar15 = psVar46;
          } while (lVar27 != 0);
          uVar12 = 0;
          psVar14 = group;
          lVar27 = 0;
          do {
            secp256k1_ge_mul_lambda
                      ((secp256k1_ge *)seed16,(secp256k1_ge *)((long)group[0].x.n + lVar27));
            ge_equals_ge(psVar14 + (uVar12 / 0xd) * -0xd,(secp256k1_ge *)seed16);
            lVar27 = lVar27 + 0x68;
            psVar14 = psVar14 + 9;
            uVar12 = uVar12 + 9;
          } while (lVar27 != 0x548);
          a = (secp256k1_context *)group;
          secp256k1_ge_verify((secp256k1_ge *)a);
          if (group[0].infinity == 0) goto LAB_00117a8d;
          a = (secp256k1_context *)groupj;
          secp256k1_gej_verify((secp256k1_gej *)a);
          if (groupj[0].infinity == 0) goto LAB_00117a92;
          lVar27 = 0xc;
          psVar28 = (secp256k1_context *)(group + 1);
          a_00 = (secp256k1_context *)(groupj + 1);
          do {
            a = psVar28;
            secp256k1_ge_verify((secp256k1_ge *)psVar28);
            if ((psVar28->ecmult_gen_ctx).initial.y.magnitude != 0) goto LAB_00117a6a;
            a = a_00;
            secp256k1_gej_verify((secp256k1_gej *)a_00);
            if ((a_00->ecmult_gen_ctx).initial.z.magnitude != 0) goto LAB_00117a6f;
            a_00 = (secp256k1_context *)&(a_00->ecmult_gen_ctx).initial.infinity;
            psVar28 = (secp256k1_context *)&(psVar28->ecmult_gen_ctx).initial.z;
            lVar27 = lVar27 + -1;
          } while (lVar27 != 0);
          psVar14 = group;
          local_1af0 = (secp256k1_scalar *)0x0;
          local_1ae8 = 0;
          do {
            if (((ulong)num_cores == 1) ||
               (local_1ae8 = local_1ae8 + 0xe7037ed1a0b428db,
               (uint32_t)((local_1ae8 >> 0x20 ^ local_1ae8 & 0xffffffff) * (ulong)num_cores >> 0x20)
               == this_core)) {
              secp256k1_fe_inv((secp256k1_fe *)&scalar_i,&groupj[(long)local_1af0].z);
              lVar27 = 0;
              psVar33 = psVar14;
              psVar52 = local_1af0;
              do {
                psVar48 = psVar33 + ((ulong)psVar52 / 0xd) * -0xd;
                psVar15 = (secp256k1_gej *)((long)groupj[0].x.n + lVar27);
                secp256k1_gej_add_var
                          ((secp256k1_gej *)seed16,psVar15,
                           (secp256k1_gej *)&groupj[(long)local_1af0].x,
                           (secp256k1_fe *)0x4ec4ec4ec4ec4ec5);
                ge_equals_gej(psVar48,(secp256k1_gej *)seed16);
                if (local_1af0 != (secp256k1_scalar *)0x0) {
                  secp256k1_gej_add_ge
                            ((secp256k1_gej *)seed16,psVar15,
                             (secp256k1_ge *)&group[(long)local_1af0].x);
                  ge_equals_gej(psVar48,(secp256k1_gej *)seed16);
                }
                secp256k1_gej_add_ge_var
                          ((secp256k1_gej *)seed16,psVar15,
                           (secp256k1_ge *)&group[(long)local_1af0].x,(secp256k1_fe *)0x0);
                ge_equals_gej(psVar48,(secp256k1_gej *)seed16);
                local_1458 = groupj[(long)local_1af0].infinity;
                nums_x.n[4] = groupj[(long)local_1af0].x.n[4];
                nums_x.magnitude = groupj[(long)local_1af0].x.magnitude;
                nums_x.normalized = groupj[(long)local_1af0].x.normalized;
                nums_x.n[3] = groupj[(long)local_1af0].x.n[3];
                nums_x.n[2] = groupj[(long)local_1af0].x.n[2];
                nums_x.n[1] = groupj[(long)local_1af0].x.n[1];
                nums_x.n[0] = groupj[(long)local_1af0].x.n[0];
                local_1488._0_8_ = groupj[(long)local_1af0].y.n[0];
                local_1488._8_8_ = groupj[(long)local_1af0].y.n[1];
                local_1488._16_16_ = *(undefined1 (*) [16])(groupj[(long)local_1af0].y.n + 2);
                local_1468 = (undefined4)groupj[(long)local_1af0].y.n[4];
                uStack_1464 = *(undefined4 *)((long)groupj[(long)local_1af0].y.n + 0x24);
                iStack_1460 = groupj[(long)local_1af0].y.magnitude;
                iStack_145c = groupj[(long)local_1af0].y.normalized;
                secp256k1_gej_add_zinv_var
                          ((secp256k1_gej *)seed16,psVar15,(secp256k1_ge *)&nums_x,
                           (secp256k1_fe *)&scalar_i);
                ge_equals_gej(psVar48,(secp256k1_gej *)seed16);
                lVar27 = lVar27 + 0x98;
                psVar33 = psVar33 + 1;
                psVar52 = (secp256k1_scalar *)((long)psVar52 + 1);
              } while (lVar27 != 0x7b8);
            }
            local_1af0 = (secp256k1_scalar *)((long)local_1af0 + 1);
            psVar14 = psVar14 + 1;
          } while (local_1af0 != (secp256k1_scalar *)0xd);
          psVar15 = groupj;
          uVar8 = 0;
          uVar12 = 0;
          do {
            secp256k1_gej_double((secp256k1_gej *)seed16,psVar15);
            uVar19 = uVar8 - 0xd;
            if (uVar12 < 7) {
              uVar19 = uVar8;
            }
            ge_equals_gej((secp256k1_ge *)&group[uVar19].x,(secp256k1_gej *)seed16);
            secp256k1_gej_double_var((secp256k1_gej *)seed16,psVar15,(secp256k1_fe *)0x0);
            ge_equals_gej((secp256k1_ge *)&group[uVar19].x,(secp256k1_gej *)seed16);
            uVar12 = uVar12 + 1;
            uVar8 = uVar8 + 2;
            psVar15 = psVar15 + 1;
          } while (uVar12 != 0xd);
          lVar27 = 0x68;
          psVar14 = group + 0xc;
          psVar15 = groupj;
          do {
            psVar15 = psVar15 + 1;
            secp256k1_ge_neg((secp256k1_ge *)&nums_x,(secp256k1_ge *)((long)group[0].x.n + lVar27));
            ge_equals_ge(psVar14,(secp256k1_ge *)&nums_x);
            secp256k1_gej_neg((secp256k1_gej *)seed16,psVar15);
            ge_equals_gej(psVar14,(secp256k1_gej *)seed16);
            lVar27 = lVar27 + 0x68;
            psVar14 = psVar14 + -1;
          } while (lVar27 != 0x548);
          lVar27 = 1;
          na_00 = (_func_void_char_ptr_void_ptr *)0x68;
          local_1ad8 = 0;
          do {
            uVar12 = 0;
            psVar14 = group;
            do {
              if (((ulong)num_cores == 1) ||
                 (local_1ad8 = local_1ad8 + 0xe7037ed1a0b428db,
                 (uint32_t)
                 ((local_1ad8 >> 0x20 ^ local_1ad8 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core)) {
                iVar7 = 0;
                psVar33 = psVar14;
                uVar49 = uVar12;
                do {
                  _na = CONCAT44(sStack_1a14,iVar7);
                  ng = (int)uVar12;
                  psStack_1a90 = &nums_x;
                  _ng_1 = (secp256k1_fe *)&scalar_i;
                  local_1a88._0_8_ = seed16;
                  secp256k1_ecmult_strauss_wnaf
                            ((secp256k1_strauss_state *)&ng_1,&tmp_3,1,
                             (secp256k1_gej *)&groupj[lVar27].x,&na,&ng);
                  ge_equals_gej(psVar33 + (uVar49 / 0xd) * -0xd,&tmp_3);
                  iVar7 = iVar7 + 1;
                  psVar33 = (secp256k1_ge *)((long)(psVar33->x).n + (long)na_00);
                  uVar49 = uVar49 + lVar27;
                } while (iVar7 != 0xd);
              }
              uVar12 = uVar12 + 1;
              psVar14 = psVar14 + 1;
            } while ((int)uVar12 != 0xd);
            lVar27 = lVar27 + 1;
            na_00 = na_00 + 0x68;
          } while (lVar27 != 0xd);
          local_1af8 = 0;
          do {
            lVar27 = 0;
            do {
              if (((ulong)num_cores == 1) ||
                 (local_1ad8 = local_1ad8 + 0xe7037ed1a0b428db,
                 (uint32_t)
                 ((local_1ad8 >> 0x20 ^ local_1ad8 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core)) {
                ng_1 = (int)local_1af8;
                psVar22 = &group[lVar27].x;
                secp256k1_ecmult_const((secp256k1_gej *)seed16,(secp256k1_ge *)psVar22,&ng_1);
                uVar8 = (int)lVar27 * (int)local_1af8;
                __stream = (FILE *)&group[uVar8 - (uVar8 / 0xd + (uVar8 / 0xd) * 0xc)].x;
                ge_equals_gej((secp256k1_ge *)__stream,(secp256k1_gej *)seed16);
                if (lVar27 != 0 && local_1af8 != 0) {
                  a = (secp256k1_context *)&tmp_3;
                  psVar28 = a;
                  iVar7 = secp256k1_ecmult_const_xonly
                                    ((secp256k1_fe *)a,psVar22,(secp256k1_fe *)0x0,&ng_1,0);
                  if (iVar7 == 0) goto LAB_00117a3d;
                  iVar7 = secp256k1_fe_equal_var((secp256k1_fe *)a,(secp256k1_fe *)__stream);
                  psVar28 = a;
                  if (iVar7 == 0) goto LAB_00117a42;
                  iVar7 = -0xb;
                  do {
                    iVar7 = iVar7 + 1;
                    if (iVar7 == 0) goto LAB_00117a79;
                    a = (secp256k1_context *)&scalar_i;
                    random_fe((secp256k1_fe *)a);
                    secp256k1_fe_normalize((secp256k1_fe *)a);
                    secp256k1_fe_verify((secp256k1_fe *)a);
                    if (iStack_178c == 0) {
                      main_cold_40();
                      goto LAB_001179fe;
                    }
                    auVar5[0xf] = uStack_1799;
                    auVar5._0_15_ = local_17a8;
                    auVar4._4_4_ = sStack_17b4;
                    auVar4._0_4_ = scalar_i;
                    auVar4[8] = (uchar)uStack_17b0;
                    auVar4[9] = uStack_17b0._1_1_;
                    auVar4[10] = uStack_17b0._2_1_;
                    auVar4[0xb] = uStack_17b0._3_1_;
                    auVar4[0xc] = uStack_17b0._4_1_;
                    auVar4[0xd] = uStack_17b0._5_1_;
                    auVar4[0xe] = uStack_17b0._6_1_;
                    auVar4[0xf] = uStack_17b0._7_1_;
                  } while ((SUB168(auVar5 | auVar4,8) == 0 && SUB168(auVar5 | auVar4,0) == 0) &&
                           CONCAT44(local_1798._4_4_,local_1798._0_4_) == 0);
                  secp256k1_fe_mul(&nums_x,(secp256k1_fe *)&scalar_i,psVar22);
                  na_00 = (_func_void_char_ptr_void_ptr *)0x0;
                  psVar28 = (secp256k1_context *)&tmp_3;
                  iVar7 = secp256k1_ecmult_const_xonly
                                    ((secp256k1_fe *)&tmp_3,&nums_x,(secp256k1_fe *)&scalar_i,&ng_1,
                                     0);
                  if (iVar7 == 0) goto LAB_00117a47;
                  iVar7 = secp256k1_fe_equal_var((secp256k1_fe *)&tmp_3,(secp256k1_fe *)__stream);
                  psVar28 = (secp256k1_context *)seed16;
                  if (iVar7 == 0) goto LAB_00117a4c;
                }
              }
              lVar27 = lVar27 + 1;
            } while (lVar27 != 0xd);
            local_1af8 = local_1af8 + 1;
          } while (local_1af8 != 0xd);
          local_1aa0 = &ctx->error_callback;
          scratch = secp256k1_scratch_create(local_1aa0,0x1000);
          local_1ab0 = 0;
          local_19e0 = (void *)0x0;
          local_19d8 = scratch;
          do {
            uVar40 = 0;
            do {
              local_1aa8 = 0;
              local_19a0 = uVar40;
              do {
                uVar39 = 0;
                do {
                  if ((ulong)num_cores == 1) {
LAB_00116623:
                    local_1990 = &group[uVar39].x;
                    local_19a8 = uVar39;
                    local_1998 = uVar39 * local_1ab0 + local_1aa8;
                    lVar27 = 0;
                    do {
                      uVar18 = (undefined4)local_1ab0;
                      uVar36 = (undefined4)uVar40;
                      seed16[0] = (uchar)uVar18;
                      seed16[1] = (uchar)((uint)uVar18 >> 8);
                      seed16[2] = (uchar)((uint)uVar18 >> 0x10);
                      seed16[3] = (uchar)((uint)uVar18 >> 0x18);
                      seed16[4] = (uchar)uVar36;
                      seed16[5] = (uchar)((uint)uVar36 >> 8);
                      seed16[6] = (uchar)((uint)uVar36 >> 0x10);
                      seed16[7] = (uchar)((uint)uVar36 >> 0x18);
                      _na = CONCAT44(sStack_1a14,(int)local_1aa8);
                      psVar22 = local_1990;
                      puVar30 = (uint64_t *)(seed16 + 8);
                      for (lVar21 = 0xd; lVar21 != 0; lVar21 = lVar21 + -1) {
                        *puVar30 = psVar22->n[0];
                        psVar22 = (secp256k1_fe *)((long)psVar22 + (ulong)bVar54 * -0x10 + 8);
                        puVar30 = puVar30 + (ulong)bVar54 * -2 + 1;
                      }
                      local_1988 = lVar27;
                      psVar22 = &group[lVar27].x;
                      puVar30 = local_1148;
                      for (pvVar23 = (void *)0xd; pvVar23 != (void *)0x0;
                          pvVar23 = (void *)((long)pvVar23 + -1)) {
                        *puVar30 = psVar22->n[0];
                        psVar22 = (secp256k1_fe *)((long)psVar22 + (ulong)bVar54 * -0x10 + 8);
                        puVar30 = puVar30 + (ulong)bVar54 * -2 + 1;
                      }
                      secp256k1_gej_set_infinity((secp256k1_gej *)&scalar_i);
                      if (scratch == (secp256k1_scratch *)0x0) {
                        secp256k1_ecmult_multi_simple_var
                                  ((secp256k1_gej *)&scalar_i,&na,
                                   (secp256k1_ecmult_multi_callback *)seed16,pvVar23,(size_t)na_00);
                      }
                      else {
                        lVar27 = 0;
                        do {
                          if (scratch->magic[lVar27] != "scratch"[lVar27]) {
                            (*(ctx->error_callback).fn)
                                      ("invalid scratch space",(ctx->error_callback).data);
                            uVar12 = 0;
                            goto LAB_00116739;
                          }
                          lVar27 = lVar27 + 1;
                        } while (lVar27 != 8);
                        uVar49 = scratch->max_size - scratch->alloc_size;
                        uVar12 = 0;
                        if (0x59 < uVar49) {
                          uVar12 = uVar49 - 0x5a;
                        }
LAB_00116739:
                        pvVar23 = (void *)0x1;
                        na_00 = (_func_void_char_ptr_void_ptr *)&DAT_0012a180;
                        uVar49 = 0;
                        do {
                          if (pvVar23 == (void *)0xd) break;
                          if (pvVar23 < (void *)0xd) {
                            uVar42 = *(ulong *)na_00;
                          }
                          else {
                            uVar42 = 0;
                          }
                          uVar26 = (ulong)(byte)(((short)pvVar23 - 0x80U & 0xff) /
                                                (ushort)(byte)((byte)pvVar23 + 1));
                          uVar41 = (0x98L << ((byte)pvVar23 & 0x3f)) + uVar26 * 8 + 0x110;
                          if (uVar12 < uVar41) break;
                          uVar41 = (uVar12 - uVar41) / (uVar26 * 8 + 0x100);
                          uVar26 = uVar42;
                          if (uVar41 < uVar42) {
                            uVar26 = uVar41;
                          }
                          if (uVar49 < uVar26) {
                            uVar49 = uVar26;
                          }
                          na_00 = na_00 + 8;
                          pvVar23 = (void *)((long)pvVar23 + 1);
                        } while (uVar42 <= uVar41);
                        if (uVar49 != 0) {
                          lVar27 = 0;
                          do {
                            pvVar23 = (void *)CONCAT71((int7)((ulong)pvVar23 >> 8),
                                                       scratch->magic[lVar27]);
                            if (scratch->magic[lVar27] != "scratch"[lVar27]) {
                              (*(ctx->error_callback).fn)
                                        ("invalid scratch space",(ctx->error_callback).data);
                              goto LAB_00116ac9;
                            }
                            lVar27 = lVar27 + 1;
                          } while (lVar27 != 8);
                          uVar12 = scratch->max_size - scratch->alloc_size;
                          pvVar23 = (void *)0x0;
                          if (0x4a < uVar12) {
                            pvVar23 = (void *)(uVar12 - 0x4b);
                          }
                          if ((void *)0x70b < pvVar23) {
                            local_1a58 = (long)pvVar23 - 0xe18;
                            local_1ac0 = (secp256k1_gej *)(ulong)(local_1a58 < 0xfffffffffffff8f4);
                            local_1ab8 = (char **)((long)(local_1ac0->x).n + 1);
                            ppcVar29 = (char **)0x2;
                            bVar17 = 0;
                            local_1af0 = &na;
                            lVar27 = 0;
                            do {
                              num = local_1ab8;
                              if (ppcVar29 < local_1ab8) {
                                num = ppcVar29;
                              }
                              lVar27 = lVar27 << ((byte)local_1ac0 & 0x3f);
                              lVar21 = 0;
                              psVar15 = local_1ac0;
                              do {
                                psVar15 = (secp256k1_gej *)
                                          CONCAT71((int7)((ulong)psVar15 >> 8),
                                                   scratch->magic[lVar21]);
                                if (scratch->magic[lVar21] != "scratch"[lVar21]) {
                                  (*(ctx->error_callback).fn)
                                            ("invalid scratch space",(ctx->error_callback).data);
                                  sVar45 = 0;
                                  goto LAB_00116884;
                                }
                                lVar21 = lVar21 + 1;
                              } while (lVar21 != 8);
                              sVar45 = scratch->alloc_size;
LAB_00116884:
                              secp256k1_gej_set_infinity((secp256k1_gej *)&nums_x);
                              error_callback = local_1aa0;
                              if (ppcVar29 != (char **)0x0 || local_1af0 != (secp256k1_scalar *)0x0)
                              {
                                local_19d0 = sVar45;
                                psVar15 = (secp256k1_gej *)
                                          secp256k1_scratch_alloc
                                                    (local_1aa0,scratch,(long)num * 0x98);
                                local_1978 = (_func_void_char_ptr_void_ptr *)
                                             secp256k1_scratch_alloc
                                                       (error_callback,scratch,(long)num * 4);
                                psVar24 = scratch;
                                local_1980 = secp256k1_scratch_alloc
                                                       (error_callback,scratch,(long)num * 0xc0);
                                uVar18 = SUB84(psVar24,0);
                                _ng_1 = (secp256k1_fe *)local_1980;
                                pvVar23 = secp256k1_scratch_alloc
                                                    (error_callback,scratch,(long)num * 0x1a0);
                                psStack_1a90 = (secp256k1_fe *)pvVar23;
                                pvVar16 = secp256k1_scratch_alloc
                                                    (error_callback,scratch,(long)num * 0x410);
                                na_00 = local_1978;
                                scratch = local_19d8;
                                local_1a88._0_8_ = pvVar16;
                                auVar55._0_4_ =
                                     -(uint)((int)psVar15 == 0 && (int)((ulong)psVar15 >> 0x20) == 0
                                            );
                                auVar55._4_4_ =
                                     -(uint)((int)local_1978 == 0 &&
                                            (int)((ulong)local_1978 >> 0x20) == 0);
                                auVar55._8_4_ =
                                     -(uint)((int)local_1980 == 0 &&
                                            (int)((ulong)local_1980 >> 0x20) == 0);
                                auVar55._12_4_ =
                                     -(uint)((int)pvVar23 == 0 && (int)((ulong)pvVar23 >> 0x20) == 0
                                            );
                                iVar7 = movmskps(uVar18,auVar55);
                                if ((iVar7 != 0) || (pvVar16 == (void *)0x0)) {
                                  secp256k1_scratch_apply_checkpoint
                                            (local_1aa0,local_19d8,local_19d0);
                                  break;
                                }
                                if (ppcVar29 != (char **)0x0) {
                                  puVar30 = (uint64_t *)(seed16 + lVar27 * 0x68 + 8);
                                  ppcVar34 = (char **)0x0;
                                  psVar46 = psVar15;
                                  do {
                                    *(undefined4 *)(na_00 + (long)ppcVar34 * 4) =
                                         *(undefined4 *)(seed16 + (long)ppcVar34 * 4 + lVar27 * 4);
                                    puVar38 = puVar30;
                                    psVar37 = &tmp_3;
                                    for (lVar21 = 0xd; lVar21 != 0; lVar21 = lVar21 + -1) {
                                      (psVar37->x).n[0] = *puVar38;
                                      puVar38 = puVar38 + (ulong)bVar54 * -2 + 1;
                                      psVar37 = (secp256k1_gej *)
                                                ((long)psVar37 + (ulong)bVar54 * -0x10 + 8);
                                    }
                                    secp256k1_gej_set_ge(psVar46,(secp256k1_ge *)&tmp_3);
                                    ppcVar34 = (char **)((long)ppcVar34 + 1);
                                    psVar46 = psVar46 + 1;
                                    puVar30 = puVar30 + 0xd;
                                  } while (num != ppcVar34);
                                }
                                secp256k1_ecmult_strauss_wnaf
                                          ((secp256k1_strauss_state *)&ng_1,(secp256k1_gej *)&nums_x
                                           ,(size_t)num,psVar15,(secp256k1_scalar *)na_00,local_1af0
                                          );
                                scratch = local_19d8;
                                secp256k1_scratch_apply_checkpoint(local_1aa0,local_19d8,local_19d0)
                                ;
                              }
                              bVar53 = 0xfffffffffffff8f3 < local_1a58;
                              secp256k1_gej_add_var
                                        ((secp256k1_gej *)&scalar_i,(secp256k1_gej *)&scalar_i,
                                         (secp256k1_gej *)&nums_x,&psVar15->x);
                              ppcVar29 = (char **)((long)ppcVar29 - (long)num);
                              bVar6 = bVar17 ^ 1;
                              lVar27 = 1;
                              local_1af0 = (secp256k1_scalar *)0x0;
                              bVar17 = 1;
                            } while ((bool)(bVar53 & bVar6));
                            goto LAB_00116ae6;
                          }
                        }
LAB_00116ac9:
                        secp256k1_ecmult_multi_simple_var
                                  ((secp256k1_gej *)&scalar_i,&na,
                                   (secp256k1_ecmult_multi_callback *)seed16,pvVar23,(size_t)na_00);
                      }
LAB_00116ae6:
                      lVar27 = local_1988;
                      uVar40 = local_19a0;
                      uVar8 = (int)local_1988 * (int)local_19a0 + (int)local_1998;
                      ge_equals_gej((secp256k1_ge *)
                                    &group[uVar8 - (uVar8 / 0xd + (uVar8 / 0xd) * 0xc)].x,
                                    (secp256k1_gej *)&scalar_i);
                      lVar27 = lVar27 + 1;
                      uVar39 = local_19a8;
                    } while (lVar27 != 0xd);
                  }
                  else {
                    local_19e0 = (void *)((long)local_19e0 + 0xe7037ed1a0b428db);
                    if ((uint32_t)
                        (((ulong)local_19e0 >> 0x20 ^ (ulong)local_19e0 & 0xffffffff) *
                         (ulong)num_cores >> 0x20) == this_core) goto LAB_00116623;
                  }
                  uVar39 = uVar39 + 1;
                } while (uVar39 != 0xd);
                local_1aa8 = local_1aa8 + 1;
              } while (local_1aa8 != 0xd);
              uVar40 = uVar40 + 1;
            } while (uVar40 != 0xd);
            local_1ab0 = local_1ab0 + 1;
          } while (local_1ab0 != 0xd);
          secp256k1_scratch_destroy(local_1aa0,scratch);
          iVar7 = 1;
          uVar12 = 0;
          do {
            iVar32 = 1;
            do {
              if (((ulong)num_cores == 1) ||
                 (uVar12 = uVar12 + 0xe7037ed1a0b428db,
                 (uint32_t)((uVar12 >> 0x20 ^ uVar12 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core)) {
                tmp_3.x.n[0]._0_4_ = 1;
                iVar50 = 1;
                do {
                  nums_x.n[0] = 0;
                  nums_x.n[1] = 0;
                  nums_x.n._16_15_ = SUB1615((undefined1  [16])0x0,0);
                  nums_x.n[3]._7_1_ = (char)iVar32;
                  local_17a8 = SUB1615((undefined1  [16])0x0,0);
                  scalar_i = 0;
                  sStack_17b4 = 0;
                  uStack_17b0._0_1_ = '\0';
                  uStack_17b0._1_1_ = '\0';
                  uStack_17b0._2_1_ = '\0';
                  uStack_17b0._3_1_ = '\0';
                  uStack_17b0._4_1_ = '\0';
                  uStack_17b0._5_1_ = '\0';
                  uStack_17b0._6_1_ = '\0';
                  uStack_17b0._7_1_ = '\0';
                  uStack_1799 = (uchar)iVar7;
                  psVar28 = ctx;
                  iVar9 = secp256k1_ecdsa_sign
                                    (ctx,(secp256k1_ecdsa_signature *)seed16,(uchar *)&scalar_i,
                                     (uchar *)&nums_x,secp256k1_nonce_function_smallint,&tmp_3);
                  if (iVar9 != 1) {
                    main_cold_8();
LAB_00117a38:
                    main_cold_9();
                    goto LAB_00117a3d;
                  }
                  lVar27 = 0;
                  uVar8 = 0;
                  do {
                    uVar19 = (uint)seed16[lVar27] | uVar8 << 8;
                    uVar8 = uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc);
                    if (uVar19 < 0xd) {
                      uVar8 = uVar19;
                    }
                    lVar27 = lVar27 + 1;
                  } while (lVar27 != 0x20);
                  uVar19 = 0;
                  lVar27 = 0x20;
                  do {
                    uVar20 = (uint)seed16[lVar27] | uVar19 << 8;
                    uVar19 = uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc);
                    if (uVar20 < 0xd) {
                      uVar19 = uVar20;
                    }
                    lVar27 = lVar27 + 1;
                  } while (lVar27 != 0x40);
                  psVar28 = (secp256k1_context *)&ng_1;
                  r_from_k((secp256k1_scalar *)psVar28,group,(int)tmp_3.x.n[0],(int *)(ulong)uVar20)
                  ;
                  if (uVar8 != ng_1) goto LAB_00117a38;
                  iVar9 = (int)tmp_3.x.n[0];
                  uVar20 = (int)tmp_3.x.n[0] * uVar19;
                  uVar8 = uVar8 * iVar32 + iVar7;
                  iVar43 = uVar8 - (uVar8 / 0xd + (uVar8 / 0xd) * 0xc);
                  if ((uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc) != iVar43) &&
                     (uVar8 = (0xd - uVar19) * (int)tmp_3.x.n[0],
                     uVar8 - (uVar8 / 0xd + (uVar8 / 0xd) * 0xc) != iVar43)) goto LAB_00117a51;
                  if ((int)tmp_3.x.n[0] < iVar50) break;
                  iVar50 = (int)tmp_3.x.n[0] + 1;
                  tmp_3.x.n[0]._0_4_ = iVar50;
                } while (iVar9 < 0xc);
              }
              iVar32 = iVar32 + 1;
            } while (iVar32 != 0xd);
            iVar7 = iVar7 + 1;
          } while (iVar7 != 0xd);
          uVar8 = 1;
          local_1af8._0_4_ = -1;
          local_1ae8 = 0;
          uVar10 = num_cores;
          do {
            uVar12 = 1;
            iVar7 = 2;
            do {
              local_1ac0 = (secp256k1_gej *)CONCAT44(local_1ac0._4_4_,1);
              local_1a58 = CONCAT44(local_1a58._4_4_,iVar7);
              do {
                lVar27 = 1;
                uVar49 = uVar12 & 0xffffffff;
                local_1ab8 = (char **)CONCAT44(local_1ab8._4_4_,iVar7);
                do {
                  if ((uVar10 == 1) ||
                     (local_1ae8 = local_1ae8 + 0xe7037ed1a0b428db,
                     (uint32_t)
                     ((ulong)uVar10 * (local_1ae8 >> 0x20 ^ local_1ae8 & 0xffffffff) >> 0x20) ==
                     this_core)) {
                    uVar19 = iVar7 - ((int)(uVar49 / 0xd) + (int)(uVar49 / 0xd) * 0xc);
                    piVar25 = (int *)(ulong)((uVar19 / 0xd) * 3);
                    iVar50 = uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc);
                    uVar42 = 0;
                    uVar19 = 0;
                    iVar32 = 0;
                    do {
                      r_from_k((secp256k1_scalar *)seed16,group,iVar32,piVar25);
                      if (uVar12 == (seed16._0_8_ & 0xffffffff)) {
                        bVar53 = (int)(uVar42 / 0xd) + (int)(uVar42 / 0xd) * 0xc + iVar50 == 0;
                        piVar25 = (int *)(ulong)bVar53;
                        uVar19 = uVar19 | bVar53;
                      }
                      iVar32 = iVar32 + 1;
                      iVar50 = iVar50 + (int)local_1af8;
                      uVar42 = (ulong)((int)uVar42 + uVar8);
                    } while (iVar32 != 0xd);
                    local_17a8 = SUB1615((undefined1  [16])0x0,1);
                    scalar_i = 0;
                    sStack_17b4 = 0;
                    uStack_17b0._0_1_ = '\0';
                    uStack_17b0._1_1_ = '\0';
                    uStack_17b0._2_1_ = '\0';
                    uStack_17b0._3_1_ = '\0';
                    uStack_17b0._4_1_ = '\0';
                    uStack_17b0._5_1_ = '\0';
                    uStack_17b0._6_1_ = '\0';
                    uStack_17b0._7_1_ = '\0';
                    uStack_1799 = (uchar)uVar12;
                    auStack_1788 = SUB1615((undefined1  [16])0x0,1);
                    local_1798[0] = '\0';
                    local_1798[1] = '\0';
                    local_1798[2] = '\0';
                    local_1798[3] = '\0';
                    local_1798[4] = '\0';
                    local_1798[5] = '\0';
                    local_1798[6] = '\0';
                    local_1798[7] = '\0';
                    iStack_1790 = 0;
                    iStack_178c = 0;
                    local_1779 = (uchar)uVar8;
                    psVar22 = &group[lVar27].x;
                    psVar14 = (secp256k1_ge *)seed16;
                    for (lVar21 = 0xd; lVar21 != 0; lVar21 = lVar21 + -1) {
                      (psVar14->x).n[0] = psVar22->n[0];
                      psVar22 = (secp256k1_fe *)((long)psVar22 + (ulong)bVar54 * -0x10 + 8);
                      psVar14 = (secp256k1_ge *)((long)psVar14 + (ulong)bVar54 * -0x10 + 8);
                    }
                    secp256k1_ge_to_storage((secp256k1_ge_storage *)&nums_x,(secp256k1_ge *)seed16);
                    tmp_3.y.n[1] = local_1488._8_8_;
                    tmp_3.y.n[0] = local_1488._0_8_;
                    tmp_3.x.magnitude = nums_x.magnitude;
                    tmp_3.x.n[4] = nums_x.n[4];
                    tmp_3.x.normalized = nums_x.normalized;
                    tmp_3.x.n[2] = nums_x.n[2];
                    tmp_3.x.n[3] = nums_x.n[3];
                    tmp_3.x.n[0] = nums_x.n[0];
                    tmp_3.x.n[1] = nums_x.n[1];
                    nums_x.n[0] = 0;
                    nums_x.n[1] = 0;
                    nums_x.n._16_15_ = SUB1615((undefined1  [16])0x0,0);
                    nums_x.n[3]._7_1_ = (char)local_1ac0;
                    a = ctx;
                    uVar20 = secp256k1_ecdsa_verify
                                       (ctx,(secp256k1_ecdsa_signature *)&scalar_i,(uchar *)&nums_x,
                                        (secp256k1_pubkey *)&tmp_3);
                    uVar10 = num_cores;
                    if ((uVar8 < 7 & uVar19) != uVar20) goto LAB_00117a74;
                  }
                  lVar27 = lVar27 + 1;
                  iVar7 = iVar7 + (int)uVar12;
                  uVar49 = (ulong)(uint)((int)uVar49 + (int)uVar12);
                } while (lVar27 != 0xd);
                iVar32 = (int)local_1ac0 + 1;
                iVar7 = (int)local_1ab8 + 1;
                local_1ac0 = (secp256k1_gej *)CONCAT44(local_1ac0._4_4_,iVar32);
              } while (iVar32 != 0xd);
              uVar12 = uVar12 + 1;
              iVar7 = (int)local_1a58 + 1;
            } while (uVar12 != 0xd);
            uVar8 = uVar8 + 1;
            local_1af8._0_4_ = (int)local_1af8 + -1;
          } while (uVar8 != 0xd);
          uVar12 = 1;
          puVar35 = local_17f8;
          psVar15 = &tmp_3;
          do {
            _ng = (undefined1  [16])0x0;
            local_1a38._0_15_ = SUB1615((undefined1  [16])0x0,0);
            local_1a38[0xf] = (char)uVar12;
            lVar27 = uVar12 - 1;
            a = ctx;
            iVar7 = secp256k1_keypair_create
                              (ctx,(secp256k1_keypair *)(seed16 + lVar27 * 0x60),(uchar *)&ng);
            if (iVar7 == 0) goto LAB_00117aba;
            pubkey = (secp256k1_pubkey *)((long)&nums_x + lVar27 * 0x40);
            a = ctx;
            iVar7 = secp256k1_ec_pubkey_create(ctx,pubkey,(uchar *)&ng);
            if (iVar7 == 0) goto LAB_00117abf;
            pubkey_00 = (secp256k1_xonly_pubkey *)(&scalar_i + lVar27 * 0x10);
            pk_parity = &ng_1 + lVar27;
            a = ctx;
            iVar7 = secp256k1_keypair_xonly_pub
                              (ctx,pubkey_00,(int *)pk_parity,
                               (secp256k1_keypair *)(seed16 + lVar27 * 0x60));
            if (iVar7 == 0) goto LAB_00117ac4;
            puVar30 = tmp_3.x.n + uVar12 * 4 + -4;
            a = ctx;
            iVar7 = secp256k1_xonly_pubkey_serialize(ctx,(uchar *)puVar30,pubkey_00);
            if (iVar7 == 0) goto LAB_00117ac9;
            a = ctx;
            iVar7 = secp256k1_xonly_pubkey_parse(ctx,pubkey_00,(uchar *)puVar30);
            if (iVar7 == 0) goto LAB_00117ace;
            a = ctx;
            iVar7 = secp256k1_xonly_pubkey_serialize(ctx,(uchar *)&ng,pubkey_00);
            if (iVar7 == 0) goto LAB_00117ad3;
            lVar27 = 0;
            do {
              if (*(char *)((long)(psVar15->x).n + lVar27) != *(char *)((long)&ng + lVar27))
              goto LAB_00117b14;
              lVar27 = lVar27 + 1;
            } while (lVar27 != 0x20);
            a = ctx;
            iVar7 = secp256k1_xonly_pubkey_from_pubkey(ctx,pubkey_00,(int *)local_19c8,pubkey);
            if (iVar7 == 0) goto LAB_00117ad8;
            if (local_19c8._0_4_ != *pk_parity) goto LAB_00117add;
            a = ctx;
            iVar7 = secp256k1_xonly_pubkey_serialize(ctx,(uchar *)&ng,pubkey_00);
            if (iVar7 == 0) goto LAB_00117ae2;
            lVar27 = 0;
            do {
              if (*(char *)((long)(psVar15->x).n + lVar27) != *(char *)((long)&ng + lVar27))
              goto LAB_00117b19;
              lVar27 = lVar27 + 1;
            } while (lVar27 != 0x20);
            a = (secp256k1_context *)&na;
            secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)a,(uchar *)puVar30);
            uStack_19f0 = (void *)0x1;
            secp256k1_fe_verify((secp256k1_fe *)a);
            psVar28 = a;
            iVar7 = secp256k1_fe_equal_var((secp256k1_fe *)a,&group[uVar12].x);
            if (iVar7 == 0) goto LAB_00117ae7;
            _na = group[uVar12].y.n[0];
            uStack_1a10 = group[uVar12].y.n[1];
            local_1a08 = group[uVar12].y.n[2];
            uStack_1a00 = group[uVar12].y.n[3];
            local_19f8 = (undefined4)group[uVar12].y.n[4];
            uStack_19f4 = *(undefined4 *)((long)group[uVar12].y.n + 0x24);
            uStack_19f0 = (void *)CONCAT44(group[uVar12].y.normalized,group[uVar12].y.magnitude);
            secp256k1_fe_normalize_var((secp256k1_fe *)a);
            secp256k1_fe_verify((secp256k1_fe *)a);
            if (uStack_19f0._4_4_ == 0) goto LAB_00117aec;
            if ((na & 1) != *pk_parity) goto LAB_00117af1;
            if (6 < uVar12) {
              lVar27 = 0;
              do {
                if (*(char *)((long)(psVar15->x).n + lVar27) != puVar35[lVar27]) goto LAB_00117b1e;
                lVar27 = lVar27 + 1;
              } while (lVar27 != 0x20);
              if ((na & 1) != 1 - (&ng_1)[0xc - uVar12]) goto LAB_00117b0a;
            }
            uVar12 = uVar12 + 1;
            psVar15 = (secp256k1_gej *)((psVar15->x).n + 4);
            puVar35 = puVar35 + -0x20;
          } while (uVar12 != 0xd);
          lVar27 = 0;
          do {
            a = ctx;
            iVar7 = secp256k1_xonly_pubkey_parse
                              (ctx,(secp256k1_xonly_pubkey *)seed16,invalid_pubkey_bytes[0] + lVar27
                              );
            if (iVar7 != 0) goto LAB_00117af6;
            lVar27 = lVar27 + 0x20;
            keypair = (secp256k1_keypair *)seed16;
          } while (lVar27 != 0xe0);
          lVar27 = -0xc;
          psVar22 = &nums_x;
          psVar52 = &na;
          output32 = &scalar_i;
          do {
            tmp_3.x.n[0] = 0;
            tmp_3.x.n[1] = 0;
            tmp_3.x.n._16_15_ = SUB1615((undefined1  [16])0x0,0);
            tmp_3.x.n[3]._7_1_ = (char)lVar27 + '\r';
            a = ctx;
            iVar7 = secp256k1_keypair_create(ctx,keypair,(uchar *)&tmp_3);
            if (iVar7 == 0) goto LAB_00117afb;
            a = ctx;
            iVar7 = secp256k1_keypair_xonly_pub
                              (ctx,(secp256k1_xonly_pubkey *)psVar22,(int *)psVar52,keypair);
            if (iVar7 == 0) goto LAB_00117b00;
            a = ctx;
            iVar7 = secp256k1_xonly_pubkey_serialize
                              (ctx,(uchar *)output32,(secp256k1_xonly_pubkey *)psVar22);
            if (iVar7 == 0) goto LAB_00117b05;
            output32 = output32 + 8;
            psVar52 = psVar52 + 1;
            psVar22 = (secp256k1_fe *)(psVar22[1].n + 2);
            keypair = keypair + 1;
            lVar27 = lVar27 + 1;
          } while (lVar27 != 0);
          _e_1 = (void *)0x8cb36fda;
          local_1af0 = (secp256k1_scalar *)0x1;
          local_1af8 = 0;
          do {
            iVar7 = 0xd - (int)local_1af0;
            if ((&iStack_1a1c)[(long)local_1af0] == 0) {
              iVar7 = (int)local_1af0;
            }
            local_1ac4 = 1;
            do {
              local_1a78 = (undefined1  [16])0x0;
              local_1a88 = (undefined1  [16])0x0;
              _ng_1 = (undefined1  [16])0x0;
              local_1a68 = 0;
              if (((ulong)num_cores == 1) ||
                 (local_1af8 = local_1af8 + 0xe7037ed1a0b428db,
                 (uint32_t)
                 ((local_1af8 >> 0x20 ^ local_1af8 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core)) {
                local_1968 = secp256k1_hardened_nonce_function_smallint;
                local_1960 = &local_1ac4;
                iVar32 = 0xd - local_1ac4;
                if ((&iStack_1a1c)[local_1ac4] == 0) {
                  iVar32 = local_1ac4;
                }
                iVar50 = 0;
                do {
                  secp256k1_testrand256((uchar *)&ng);
                  secp256k1_schnorrsig_challenge
                            (&e,rand32 + (long)local_1ac4 * 0x20,(uchar *)&ng,0x20,
                             (uchar *)(&scalar_i + ((long)local_1af0 + -1) * 8));
                  uVar12 = (ulong)e;
                  if ((&ng_1)[uVar12] == 0) {
                    uVar8 = e * iVar7 + iVar32;
                    local_19c8 = (undefined1  [16])0x0;
                    local_19b8._0_15_ = SUB1615((undefined1  [16])0x0,0);
                    local_19b8[0xf] =
                         (char)uVar8 - ((char)(uVar8 / 0xd) + (char)(uVar8 / 0xd) * '\f');
                    a = ctx;
                    iVar9 = secp256k1_schnorrsig_sign_custom
                                      (ctx,(uchar *)&tmp_3,(uchar *)&ng,0x20,
                                       (secp256k1_keypair *)
                                       (seed16 + ((long)local_1af0 + -1) * 0x60),
                                       (secp256k1_schnorrsig_extraparams *)&e_1);
                    if (iVar9 == 0) goto LAB_00117a97;
                    lVar27 = 0;
                    do {
                      if (*(uchar *)((long)tmp_3.x.n + lVar27) !=
                          rand32[lVar27 + (long)local_1ac4 * 0x20]) goto LAB_00117ab0;
                      lVar27 = lVar27 + 1;
                    } while (lVar27 != 0x20);
                    lVar27 = 0;
                    do {
                      if (*(char *)((long)tmp_3.x.n + lVar27 + 0x20) != local_19c8[lVar27])
                      goto LAB_00117ab5;
                      lVar27 = lVar27 + 1;
                    } while (lVar27 != 0x20);
                    (&ng_1)[uVar12] = 1;
                    iVar50 = iVar50 + 1;
                  }
                } while (iVar50 < 0xd);
              }
              iVar32 = local_1ac4 + 1;
              bVar53 = local_1ac4 < 0xc;
              local_1ac4 = iVar32;
            } while (bVar53);
            local_1af0 = (secp256k1_scalar *)((long)local_1af0 + 1);
          } while (local_1af0 != (secp256k1_scalar *)0xd);
          local_1ab8 = (char **)0x1;
          local_1ac0 = (secp256k1_gej *)0x0;
          do {
            puVar35 = (undefined1 *)((long)local_1ab8 + -1);
            local_1a38 = *(undefined1 (*) [16])(local_17a8 + (long)puVar35 * 0x20);
            iVar7 = 0xd - (int)local_1ab8;
            if ((&iStack_1a1c)[(long)local_1ab8] == 0) {
              iVar7 = (int)local_1ab8;
            }
            uStack_1a40 = (&uStack_17b0)[(long)puVar35 * 4];
            _ng = *(undefined8 *)(&scalar_i + (long)puVar35 * 8);
            local_1ae8 = 1;
            do {
              local_1a78 = (undefined1  [16])0x0;
              local_1a88 = (undefined1  [16])0x0;
              _ng_1 = (undefined1  [16])0x0;
              local_1a68 = 0;
              if (((ulong)num_cores == 1) ||
                 (local_1ac0 = (secp256k1_gej *)((long)local_1ac0[-0x2a150f76858d35].y.n + 0x23),
                 (uint32_t)
                 (((ulong)local_1ac0 >> 0x20 ^ (ulong)local_1ac0 & 0xffffffff) * (ulong)num_cores >>
                 0x20) == this_core)) {
                if (local_1ae8 < 7) {
                  lVar27 = local_1ae8 - 1;
                  tmp_3.x.n._16_16_ = *(undefined1 (*) [16])(local_17a8 + lVar27 * 0x20);
                  tmp_3.x.n[1] = (&uStack_17b0)[lVar27 * 4];
                  tmp_3.x.n[0] = *(uint64_t *)(&scalar_i + lVar27 * 8);
                  iVar32 = 0xd - (int)local_1ae8;
                  if ((&iStack_1a1c)[local_1ae8] == 0) {
                    iVar32 = (int)local_1ae8;
                  }
                }
                else {
                  tmp_3.x.n._0_16_ =
                       *(undefined1 (*) [16])(secp256k1_ellswift_c3.n + local_1ae8 * 4);
                  tmp_3.x.n._16_16_ =
                       *(undefined1 (*) [16])(secp256k1_ellswift_c3.n + local_1ae8 * 4 + 2);
                  iVar32 = -1;
                }
                iVar50 = 0;
                do {
                  secp256k1_testrand256(local_19c8);
                  secp256k1_schnorrsig_challenge(&e_1,(uchar *)&tmp_3,local_19c8,0x20,(uchar *)&ng);
                  uVar12 = (ulong)_e_1 & 0xffffffff;
                  if ((&ng_1)[uVar12] == 0) {
                    uVar8 = e_1 * iVar7 + iVar32;
                    iVar9 = 0;
                    uVar19 = 0;
                    do {
                      if (iVar9 == 0xe) {
                        secp256k1_testrand256((uchar *)(tmp_3.x.n + 4));
                        uVar20 = 0;
                      }
                      else {
                        tmp_3.x.n[4] = 0;
                        tmp_3.x.magnitude = 0;
                        tmp_3.x.normalized = 0;
                        tmp_3.y.n._0_15_ = SUB1615((undefined1  [16])0x0,0);
                        tmp_3.y.n[1]._7_1_ = (char)iVar9;
                        uVar20 = 0;
                        if (iVar9 != 0xd && iVar32 != -1) {
                          uVar20 = (uint)(uVar8 - (uVar8 / 0xd + (uVar8 / 0xd) * 0xc) == iVar9);
                        }
                      }
                      a = ctx;
                      uVar11 = secp256k1_schnorrsig_verify
                                         (ctx,(uchar *)&tmp_3,local_19c8,0x20,
                                          (secp256k1_xonly_pubkey *)
                                          ((long)&nums_x + (long)puVar35 * 0x40));
                      if (uVar11 != uVar20) goto LAB_00117a9c;
                      uVar19 = uVar19 + uVar20;
                      iVar9 = iVar9 + 1;
                    } while (iVar9 != 0xf);
                    if (uVar19 != (iVar32 != -1)) goto LAB_00117b0f;
                    (&ng_1)[uVar12] = 1;
                    iVar50 = iVar50 + 1;
                  }
                } while (iVar50 < 0xd);
              }
              local_1ae8 = local_1ae8 + 1;
            } while (local_1ae8 != 0xe);
            local_1ab8 = (char **)((long)local_1ab8 + 1);
          } while (local_1ab8 != (char **)0x7);
          lVar27 = -0xc;
          psVar14 = group;
          do {
            psVar14 = psVar14 + 1;
            tmp_3.x.n[0] = 0;
            tmp_3.x.n[1] = 0;
            tmp_3.x.n._16_15_ = SUB1615((undefined1  [16])0x0,0);
            tmp_3.x.n[3]._7_1_ = (char)lVar27 + '\r';
            a = ctx;
            iVar7 = secp256k1_ellswift_create(ctx,(uchar *)&nums_x,(uchar *)&tmp_3,(uchar *)0x0);
            if (iVar7 == 0) goto LAB_00117b23;
            secp256k1_ellswift_decode(ctx,(secp256k1_pubkey *)&scalar_i,(uchar *)&nums_x);
            secp256k1_pubkey_load(ctx,(secp256k1_ge *)seed16,(secp256k1_pubkey *)&scalar_i);
            ge_equals_ge((secp256k1_ge *)seed16,psVar14);
            lVar27 = lVar27 + 1;
          } while (lVar27 != 0);
          secp256k1_context_destroy(ctx);
          iVar7 = count;
        }
        goto LAB_00117a88;
      }
      goto LAB_00117aab;
    }
    goto LAB_00117a7e;
  }
LAB_00117aa1:
  main_cold_52();
LAB_00117aa6:
  main_cold_51();
LAB_00117aab:
  main_cold_49();
LAB_00117ab0:
  main_cold_19();
LAB_00117ab5:
  main_cold_20();
LAB_00117aba:
  main_cold_37();
LAB_00117abf:
  main_cold_36();
LAB_00117ac4:
  main_cold_35();
LAB_00117ac9:
  main_cold_34();
LAB_00117ace:
  main_cold_33();
LAB_00117ad3:
  main_cold_32();
LAB_00117ad8:
  main_cold_31();
LAB_00117add:
  main_cold_13();
LAB_00117ae2:
  main_cold_30();
  psVar28 = a;
LAB_00117ae7:
  a = psVar28;
  main_cold_29();
LAB_00117aec:
  main_cold_28();
LAB_00117af1:
  main_cold_15();
LAB_00117af6:
  main_cold_18();
LAB_00117afb:
  main_cold_27();
LAB_00117b00:
  main_cold_26();
LAB_00117b05:
  main_cold_25();
LAB_00117b0a:
  main_cold_17();
LAB_00117b0f:
  main_cold_22();
LAB_00117b14:
  main_cold_12();
LAB_00117b19:
  main_cold_14();
LAB_00117b1e:
  main_cold_16();
LAB_00117b23:
  main_cold_23();
  lVar27 = 0;
  do {
    uVar40 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
             secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
    uVar42 = secp256k1_test_state[1] << 0x11;
    uVar49 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar12 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar49;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar12;
    secp256k1_test_state[3] = uVar12 << 0x2d | uVar12 >> 0x13;
    secp256k1_test_state[2] = uVar49 ^ uVar42;
    (a->ecmult_gen_ctx).initial.x.n[lVar27 + -1] = uVar40;
    lVar27 = lVar27 + 1;
  } while ((int)lVar27 != 4);
  return (int)secp256k1_test_state[0];
LAB_00117a3d:
  main_cold_43();
LAB_00117a42:
  main_cold_42();
LAB_00117a47:
  main_cold_39();
LAB_00117a4c:
  main_cold_38();
LAB_00117a51:
  main_cold_10();
LAB_00117a56:
  main_cold_4();
  a = psVar28;
LAB_00117a5b:
  main_cold_5();
LAB_00117a60:
  main_cold_47();
LAB_00117a65:
  main_cold_46();
LAB_00117a6a:
  main_cold_6();
LAB_00117a6f:
  main_cold_7();
LAB_00117a74:
  main_cold_11();
LAB_00117a79:
  main_cold_41();
LAB_00117a7e:
  main_cold_50();
LAB_00117a83:
  main_cold_3();
LAB_00117a88:
  main_cold_48();
LAB_00117a8d:
  main_cold_45();
LAB_00117a92:
  main_cold_44();
LAB_00117a97:
  main_cold_24();
LAB_00117a9c:
  main_cold_21();
  goto LAB_00117aa1;
}

Assistant:

int main(int argc, char** argv) {
    int i;
    secp256k1_gej groupj[EXHAUSTIVE_TEST_ORDER];
    secp256k1_ge group[EXHAUSTIVE_TEST_ORDER];
    unsigned char rand32[32];
    secp256k1_context *ctx;

    /* Disable buffering for stdout to improve reliability of getting
     * diagnostic information. Happens right at the start of main because
     * setbuf must be used before any other operation on the stream. */
    setbuf(stdout, NULL);
    /* Also disable buffering for stderr because it's not guaranteed that it's
     * unbuffered on all systems. */
    setbuf(stderr, NULL);

    printf("Exhaustive tests for order %lu\n", (unsigned long)EXHAUSTIVE_TEST_ORDER);

    /* find iteration count */
    if (argc > 1) {
        count = strtol(argv[1], NULL, 0);
    }
    printf("test count = %i\n", count);

    /* find random seed */
    secp256k1_testrand_init(argc > 2 ? argv[2] : NULL);

    /* set up split processing */
    if (argc > 4) {
        num_cores = strtol(argv[3], NULL, 0);
        this_core = strtol(argv[4], NULL, 0);
        if (num_cores < 1 || this_core >= num_cores) {
            fprintf(stderr, "Usage: %s [count] [seed] [numcores] [thiscore]\n", argv[0]);
            return 1;
        }
        printf("running tests for core %lu (out of [0..%lu])\n", (unsigned long)this_core, (unsigned long)num_cores - 1);
    }

    /* Recreate the ecmult{,_gen} tables using the right generator (as selected via EXHAUSTIVE_TEST_ORDER) */
    secp256k1_ecmult_gen_compute_table(&secp256k1_ecmult_gen_prec_table[0][0], &secp256k1_ge_const_g, ECMULT_GEN_PREC_BITS);
    secp256k1_ecmult_compute_two_tables(secp256k1_pre_g, secp256k1_pre_g_128, WINDOW_G, &secp256k1_ge_const_g);

    while (count--) {
        /* Build context */
        ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
        secp256k1_testrand256(rand32);
        CHECK(secp256k1_context_randomize(ctx, rand32));

        /* Generate the entire group */
        secp256k1_gej_set_infinity(&groupj[0]);
        secp256k1_ge_set_gej(&group[0], &groupj[0]);
        for (i = 1; i < EXHAUSTIVE_TEST_ORDER; i++) {
            secp256k1_gej_add_ge(&groupj[i], &groupj[i - 1], &secp256k1_ge_const_g);
            secp256k1_ge_set_gej(&group[i], &groupj[i]);
            if (count != 0) {
                /* Set a different random z-value for each Jacobian point, except z=1
                   is used in the last iteration. */
                secp256k1_fe z;
                random_fe(&z);
                secp256k1_gej_rescale(&groupj[i], &z);
            }

            /* Verify against ecmult_gen */
            {
                secp256k1_scalar scalar_i;
                secp256k1_gej generatedj;
                secp256k1_ge generated;

                secp256k1_scalar_set_int(&scalar_i, i);
                secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &generatedj, &scalar_i);
                secp256k1_ge_set_gej(&generated, &generatedj);

                CHECK(group[i].infinity == 0);
                CHECK(generated.infinity == 0);
                CHECK(secp256k1_fe_equal_var(&generated.x, &group[i].x));
                CHECK(secp256k1_fe_equal_var(&generated.y, &group[i].y));
            }
        }

        /* Run the tests */
        test_exhaustive_endomorphism(group);
        test_exhaustive_addition(group, groupj);
        test_exhaustive_ecmult(group, groupj);
        test_exhaustive_ecmult_multi(ctx, group);
        test_exhaustive_sign(ctx, group);
        test_exhaustive_verify(ctx, group);

#ifdef ENABLE_MODULE_RECOVERY
        test_exhaustive_recovery(ctx, group);
#endif
#ifdef ENABLE_MODULE_EXTRAKEYS
        test_exhaustive_extrakeys(ctx, group);
#endif
#ifdef ENABLE_MODULE_SCHNORRSIG
        test_exhaustive_schnorrsig(ctx);
#endif
#ifdef ENABLE_MODULE_ELLSWIFT
    /* The ellswift algorithm does have additional edge cases when operating on
     * curves of even order, which are not included in the code as secp256k1 is
     * of odd order. Skip the ellswift tests if the used exhaustive tests curve
     * is even-ordered accordingly. */
    #if !EXHAUSTIVE_TEST_CURVE_HAS_EVEN_ORDER
        test_exhaustive_ellswift(ctx, group);
    #endif
#endif

        secp256k1_context_destroy(ctx);
    }

    secp256k1_testrand_finish();

    printf("no problems found\n");
    return 0;
}